

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,AssignStmt *stmt)

{
  Var **ppVVar1;
  uint64_t uVar2;
  uint64_t value;
  ulong local_20;
  uint64_t stmt_hash;
  AssignStmt *stmt_local;
  HashVisitor *this_local;
  
  stmt_hash = (uint64_t)stmt;
  stmt_local = (AssignStmt *)this;
  ppVVar1 = AssignStmt::left(stmt);
  uVar2 = hash_var(*ppVVar1);
  ppVVar1 = AssignStmt::right((AssignStmt *)stmt_hash);
  value = hash_var(*ppVVar1);
  local_20 = shift(value,'\x01');
  local_20 = uVar2 ^ local_20;
  local_20 = shift(local_20,(uint8_t)(this->super_IRVisitor).level);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->stmt_hashes_,&local_20);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        uint64_t stmt_hash = hash_var(stmt->left()) ^ (shift(hash_var(stmt->right()), 1));
        // based on level
        stmt_hash = shift(stmt_hash, level);
        stmt_hashes_.emplace_back(stmt_hash);
    }